

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

breakpoint_id __thiscall
cmDebugger_impl::SetBreakpoint(cmDebugger_impl *this,string *fileName,size_t line)

{
  breakpoint_id bVar1;
  size_t nextId;
  breakpoint_id local_30;
  size_t local_28;
  
  local_28 = line;
  std::mutex::lock(&this->breakpointMutex);
  local_30 = this->nextBreakId;
  this->nextBreakId = local_30 + 1;
  std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>::
  emplace_back<unsigned_long&,std::__cxx11::string_const&,unsigned_long&>
            ((vector<cmBreakpoint,std::allocator<cmBreakpoint>> *)&this->breakpoints,&local_30,
             fileName,&local_28);
  bVar1 = local_30;
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return bVar1;
}

Assistant:

breakpoint_id SetBreakpoint(const std::string& fileName,
                              size_t line) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto nextId = nextBreakId++;
    breakpoints.emplace_back(nextId, fileName, line);
    return nextId;
  }